

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int xar_close(archive_write *a)

{
  char cVar1;
  undefined4 uVar2;
  void *pvVar3;
  archive_rb_node *paVar4;
  void *pvVar5;
  void *pvVar6;
  heap_data *heap;
  xmlChar *pxVar7;
  uint uVar8;
  int iVar9;
  mode_t mVar10;
  uint uVar11;
  wchar_t wVar12;
  archive_rb_node *self;
  xml_writer *writer;
  xmlBufferPtr pxVar13;
  xmlTextWriterPtr pxVar14;
  time_t t;
  char *pcVar15;
  la_int64_t lVar16;
  dev_t dVar17;
  int *piVar18;
  time_t tVar19;
  archive_digest *paVar20;
  ulong uVar21;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **pp_Var22;
  char *pcVar23;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar24;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  char *format;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  char *format_00;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  long lVar25;
  uint64_t offset;
  long lVar26;
  int iVar27;
  archive_rb_node *paVar28;
  size_t s;
  int iVar29;
  undefined8 uVar30;
  bool bVar31;
  char *name;
  size_t len;
  char *p;
  void *value;
  undefined8 local_a0;
  la_zstream_conflict *local_98;
  archive_digest *local_90;
  size_t local_88;
  char *local_80;
  archive_string local_78;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **local_58;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **local_50;
  uint64_t local_48;
  size_t local_40;
  void *local_38;
  
  pvVar3 = a->format_data;
  if (*(long *)(*(long *)((long)pvVar3 + 0x18) + 0x60) == 0) {
    return 0;
  }
  local_48 = *(uint64_t *)((long)pvVar3 + 8);
  for (self = __archive_rb_tree_iterate
                        ((archive_rb_tree *)((long)pvVar3 + 0x101b8),(archive_rb_node *)0x0,0);
      self != (archive_rb_node *)0x0;
      self = __archive_rb_tree_iterate((archive_rb_tree *)((long)pvVar3 + 0x101b8),self,1)) {
    paVar4 = self[1].rb_nodes[1];
    archive_entry_set_nlink((archive_entry *)paVar4[1].rb_nodes[1],*(uint *)self[1].rb_nodes);
    if (1 < *(int *)self[1].rb_nodes) {
      paVar4[3].rb_nodes[1] = paVar4;
    }
    for (paVar28 = paVar4[3].rb_nodes[0]; paVar28 != (archive_rb_node *)0x0;
        paVar28 = paVar28[3].rb_nodes[0]) {
      paVar28[3].rb_nodes[1] = paVar4;
      archive_entry_set_nlink((archive_entry *)paVar28[1].rb_nodes[1],*(uint *)self[1].rb_nodes);
    }
  }
  pvVar5 = a->format_data;
  writer = (xml_writer *)calloc(1,0x18);
  if (writer == (xml_writer *)0x0) goto LAB_00282501;
  pxVar13 = (xmlBufferPtr)xmlBufferCreate();
  writer->bp = pxVar13;
  if (pxVar13 != (xmlBufferPtr)0x0) {
    pxVar14 = (xmlTextWriterPtr)xmlNewTextWriterMemory(pxVar13,0);
    writer->writer = pxVar14;
    if (pxVar14 != (xmlTextWriterPtr)0x0) {
      writer->indent = 4;
      uVar8 = xmlTextWriterStartDocument(pxVar14,"1.0","UTF-8",0);
      if (((int)uVar8 < 0) || (uVar8 = xmlTextWriterSetIndent(pxVar14,4), (int)uVar8 < 0)) {
        pcVar23 = "xml_writer_start_document() failed: %d";
      }
      else {
        uVar8 = xmlTextWriterStartElement(pxVar14,"xar");
        if ((-1 < (int)uVar8) && (uVar8 = xmlTextWriterStartElement(pxVar14,"toc"), -1 < (int)uVar8)
           ) {
          iVar27 = 0;
          bVar31 = false;
          t = time((time_t *)0x0);
          iVar9 = xmlwrite_time(a,writer,"creation-time",t,0);
          iVar29 = -0x1e;
          if (iVar9 < 0) goto LAB_00282548;
          if (*(int *)((long)pvVar5 + 0x80) == 1) {
            iVar27 = 0x14;
          }
          iVar9 = 0x10;
          if (*(int *)((long)pvVar5 + 0x80) != 2) {
            iVar9 = iVar27;
          }
          uVar30 = extraout_RDX;
          if (iVar9 == 0) {
LAB_00281c53:
            lVar25 = *(long *)((long)pvVar5 + 0x18);
            lVar26 = *(long *)(lVar25 + 0x58);
            do {
              if (lVar25 != lVar26) {
                pvVar6 = a->format_data;
                pcVar23 = *(char **)(lVar25 + 0x88);
                cVar1 = *pcVar23;
                uVar24 = CONCAT71((int7)((ulong)uVar30 >> 8),cVar1);
                pcVar15 = pcVar23;
                while (cVar1 != '\0') {
                  if ((char)uVar24 < '\0') {
                    uVar24 = uVar24 & 0xfffffffffffffffc;
                    if ((char)uVar24 == -0x40) {
                      uVar24 = CONCAT71((int7)(uVar24 >> 8),pcVar15[1]) & 0xffffffffffffffc0;
                      uVar24 = CONCAT71((int7)(uVar24 >> 8),-(char)uVar24);
                    }
                    uVar8 = xmlTextWriterStartElement(pxVar14,"name",uVar24);
                    if ((int)uVar8 < 0) goto LAB_00282701;
                    pxVar14 = writer->writer;
                    uVar8 = xmlTextWriterWriteAttribute(pxVar14,"enctype","base64");
                    if ((int)uVar8 < 0) {
                      pcVar23 = "xml_writer_write_attribute() failed: %d";
                      goto LAB_0028271a;
                    }
                    uVar8 = xmlTextWriterWriteBase64
                                      (pxVar14,*(undefined8 *)(lVar25 + 0x88),0,
                                       *(undefined4 *)(lVar25 + 0x90));
                    if (-1 < (int)uVar8) {
                      uVar8 = xmlTextWriterEndElement(pxVar14);
                      if (-1 < (int)uVar8) goto LAB_00281d3b;
                      goto LAB_0028270a;
                    }
                    pcVar23 = "xml_writer_write_base64() failed: %d";
                    goto LAB_0028271a;
                  }
                  pcVar15 = pcVar15 + 1;
                  cVar1 = *pcVar15;
                  uVar24 = CONCAT71((int7)(uVar24 >> 8),cVar1);
                }
                iVar9 = xmlwrite_string(a,writer,"name",pcVar23);
                if (iVar9 < 0) goto LAB_0028272b;
LAB_00281d3b:
                local_78.s = (char *)0x0;
                local_78.length = 0;
                local_78.buffer_length = 0;
                mVar10 = archive_entry_filetype(*(archive_entry **)(lVar25 + 0x20));
                uVar8 = mVar10 - 0x1000 >> 0xc;
                uVar11 = mVar10 << 0x14 | uVar8;
                if ((uVar11 < 0xc) && ((0xa2bU >> (uVar8 & 0x1f) & 1) != 0)) {
                  pcVar23 = &DAT_002db090 + *(int *)(&DAT_002db090 + (ulong)uVar11 * 4);
LAB_00281daf:
                  pcVar15 = (char *)0x0;
                }
                else {
                  lVar26 = *(long *)(lVar25 + 0x50);
                  if (lVar26 == 0) {
                    pcVar23 = "file";
                    goto LAB_00281daf;
                  }
                  if (lVar26 == lVar25) {
                    local_78.length = 0;
                    archive_strncat(&local_78,"original",8);
                  }
                  else {
                    archive_string_sprintf(&local_78,"%d",(ulong)*(uint *)(lVar26 + 0x18));
                  }
                  pcVar23 = "hardlink";
                  pcVar15 = "link";
                }
                iVar9 = xmlwrite_string_attr(a,writer,"type",pcVar23,pcVar15,local_78.s);
                archive_string_free(&local_78);
                if (iVar9 < 0) goto LAB_0028272b;
                uVar30 = extraout_RDX_01;
                if ((*(byte *)(lVar25 + 0x168) & 1) == 0) {
                  mVar10 = archive_entry_filetype(*(archive_entry **)(lVar25 + 0x20));
                  if ((mVar10 == 0x2000) || (mVar10 == 0x6000)) {
                    uVar8 = xmlTextWriterStartElement(pxVar14,"device");
                    if ((int)uVar8 < 0) {
LAB_00282701:
                      pcVar23 = "xml_writer_start_element() failed: %d";
                    }
                    else {
                      dVar17 = archive_entry_rdevmajor(*(archive_entry **)(lVar25 + 0x20));
                      iVar9 = xmlwrite_fstring(a,writer,"major","%d",dVar17);
                      if (iVar9 < 0) goto LAB_0028272b;
                      dVar17 = archive_entry_rdevminor(*(archive_entry **)(lVar25 + 0x20));
                      iVar9 = xmlwrite_fstring(a,writer,"minor","%d",dVar17);
                      if (iVar9 < 0) goto LAB_0028272b;
                      pxVar14 = writer->writer;
                      uVar8 = xmlTextWriterEndElement(pxVar14);
                      if (-1 < (int)uVar8) goto LAB_00281f0a;
LAB_0028270a:
                      pcVar23 = "xml_writer_end_element() failed: %d";
                    }
LAB_0028271a:
                    archive_set_error(&a->archive,-1,pcVar23,(ulong)uVar8);
                    goto LAB_0028272b;
                  }
                  if ((mVar10 == 0xa000) &&
                     (iVar9 = xmlwrite_string_attr
                                        (a,writer,"link",*(char **)(lVar25 + 0xa0),"type","broken"),
                     iVar9 < 0)) goto LAB_0028272b;
LAB_00281f0a:
                  lVar16 = archive_entry_ino64(*(archive_entry **)(lVar25 + 0x20));
                  iVar9 = xmlwrite_fstring(a,writer,"inode","%jd",lVar16);
                  if (iVar9 < 0) goto LAB_0028272b;
                  dVar17 = archive_entry_dev(*(archive_entry **)(lVar25 + 0x20));
                  if (dVar17 != 0) {
                    dVar17 = archive_entry_dev(*(archive_entry **)(lVar25 + 0x20));
                    iVar9 = xmlwrite_fstring(a,writer,"deviceno","%d",dVar17);
                    if (iVar9 < 0) goto LAB_0028272b;
                  }
                  mVar10 = archive_entry_mode(*(archive_entry **)(lVar25 + 0x20));
                  local_a0._0_1_ = '0';
                  local_a0._1_1_ = (byte)(mVar10 >> 6) & 7 | 0x30;
                  local_a0._2_1_ = (byte)mVar10 >> 3 & 7 | 0x30;
                  local_a0._3_1_ = (byte)mVar10 & 7 | 0x30;
                  local_a0._4_4_ = local_a0._4_4_ & 0xffffff00;
                  iVar9 = xmlwrite_string(a,writer,"mode",(char *)&local_a0);
                  if (iVar9 < 0) goto LAB_0028272b;
                  lVar16 = archive_entry_uid(*(archive_entry **)(lVar25 + 0x20));
                  iVar9 = xmlwrite_fstring(a,writer,"uid","%d",lVar16);
                  if (iVar9 < 0) goto LAB_0028272b;
                  wVar12 = _archive_entry_uname_l
                                     (*(archive_entry **)(lVar25 + 0x20),&local_80,&local_88,
                                      *(archive_string_conv **)((long)pvVar6 + 0x118));
                  if (wVar12 != L'\0') {
                    piVar18 = __errno_location();
                    if (*piVar18 != 0xc) {
                      pcVar23 = archive_entry_uname(*(archive_entry **)(lVar25 + 0x20));
                      archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to UTF-8",
                                        pcVar23);
                      local_98 = (la_zstream_conflict *)CONCAT44(local_98._4_4_,0xffffffec);
                      goto LAB_00282066;
                    }
                    pcVar23 = "Can\'t allocate memory for Uname";
LAB_00282767:
                    archive_set_error(&a->archive,0xc,pcVar23);
                    goto LAB_0028272b;
                  }
                  local_98 = (la_zstream_conflict *)((ulong)local_98 & 0xffffffff00000000);
LAB_00282066:
                  if ((local_88 != 0) &&
                     (iVar9 = xmlwrite_string(a,writer,"user",local_80), iVar9 < 0))
                  goto LAB_0028272b;
                  archive_entry_gid(*(archive_entry **)(lVar25 + 0x20));
                  iVar9 = xmlwrite_fstring(a,writer,"gid","%d");
                  if (iVar9 < 0) goto LAB_0028272b;
                  wVar12 = _archive_entry_gname_l
                                     (*(archive_entry **)(lVar25 + 0x20),&local_80,&local_88,
                                      *(archive_string_conv **)((long)pvVar6 + 0x118));
                  if (wVar12 != L'\0') {
                    piVar18 = __errno_location();
                    if (*piVar18 == 0xc) {
                      pcVar23 = "Can\'t allocate memory for Gname";
                      goto LAB_00282767;
                    }
                    pcVar23 = archive_entry_gname(*(archive_entry **)(lVar25 + 0x20));
                    archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to UTF-8",
                                      pcVar23);
                    local_98 = (la_zstream_conflict *)CONCAT44(local_98._4_4_,0xffffffec);
                  }
                  if ((local_88 != 0) &&
                     (iVar9 = xmlwrite_string(a,writer,"group",local_80), iVar9 < 0))
                  goto LAB_0028272b;
                  wVar12 = archive_entry_ctime_is_set(*(archive_entry **)(lVar25 + 0x20));
                  if (wVar12 != L'\0') {
                    tVar19 = archive_entry_ctime(*(archive_entry **)(lVar25 + 0x20));
                    iVar9 = xmlwrite_time(a,writer,"ctime",tVar19,1);
                    if (iVar9 < 0) goto LAB_0028272b;
                  }
                  wVar12 = archive_entry_mtime_is_set(*(archive_entry **)(lVar25 + 0x20));
                  if (wVar12 != L'\0') {
                    tVar19 = archive_entry_mtime(*(archive_entry **)(lVar25 + 0x20));
                    iVar9 = xmlwrite_time(a,writer,"mtime",tVar19,1);
                    if (iVar9 < 0) goto LAB_0028272b;
                  }
                  wVar12 = archive_entry_atime_is_set(*(archive_entry **)(lVar25 + 0x20));
                  if (wVar12 != L'\0') {
                    tVar19 = archive_entry_atime(*(archive_entry **)(lVar25 + 0x20));
                    iVar9 = xmlwrite_time(a,writer,"atime",tVar19,1);
                    if (iVar9 < 0) goto LAB_0028272b;
                  }
                  pcVar23 = archive_entry_fflags_text(*(archive_entry **)(lVar25 + 0x20));
                  if ((pcVar23 != (char *)0x0) &&
                     ((iVar9 = make_fflags_entry(a,writer,"flags",pcVar23), iVar9 < 0 ||
                      (iVar9 = make_fflags_entry(a,writer,"ext2",pcVar23), iVar9 < 0))))
                  goto LAB_0028272b;
                  archive_entry_xattr_reset(*(archive_entry **)(lVar25 + 0x20));
                  uVar30 = extraout_RDX_02;
                  for (heap = *(heap_data **)(lVar25 + 0xc0); heap != (heap_data *)0x0;
                      heap = heap->next) {
                    archive_entry_xattr_next
                              (*(archive_entry **)(lVar25 + 0x20),(char **)&local_a0,&local_38,
                               &local_40);
                    pcVar23 = "ea";
                    uVar8 = xmlTextWriterStartElement(pxVar14);
                    if ((int)uVar8 < 0) goto LAB_00282701;
                    uVar8 = xml_writer_write_attributef(writer,pcVar23,format,(ulong)(uint)heap->id)
                    ;
                    if ((int)uVar8 < 0) {
                      pcVar23 = "xml_writer_write_attributef() failed: %d";
                      goto LAB_0028271a;
                    }
                    iVar9 = xmlwrite_heap(a,writer,heap);
                    if ((iVar9 < 0) ||
                       (iVar9 = xmlwrite_string(a,writer,"name",
                                                (char *)CONCAT44(local_a0._4_4_,
                                                                 CONCAT13(local_a0._3_1_,
                                                                          CONCAT12(local_a0._2_1_,
                                                                                   CONCAT11(local_a0
                                                  ._1_1_,(char)local_a0))))), iVar9 < 0))
                    goto LAB_0028272b;
                    pxVar14 = writer->writer;
                    uVar8 = xmlTextWriterEndElement(pxVar14);
                    if ((int)uVar8 < 0) goto LAB_0028270a;
                    uVar30 = extraout_RDX_03;
                  }
                  if (*(long *)(lVar25 + 0xe8) != 0) {
                    uVar8 = xmlTextWriterStartElement(pxVar14,"data");
                    if ((int)uVar8 < 0) goto LAB_00282701;
                    iVar9 = xmlwrite_heap(a,writer,(heap_data *)(lVar25 + 0xd0));
                    if (iVar9 < 0) goto LAB_0028272b;
                    pxVar14 = writer->writer;
                    uVar8 = xmlTextWriterEndElement(pxVar14);
                    uVar30 = extraout_RDX_04;
                    if ((int)uVar8 < 0) goto LAB_0028270a;
                  }
                  if (*(long *)(lVar25 + 0x158) != 0) {
                    uVar8 = xmlTextWriterStartElement(pxVar14,"content");
                    if ((int)uVar8 < 0) goto LAB_00282701;
                    iVar9 = xmlwrite_string(a,writer,"interpreter",*(char **)(lVar25 + 0x150));
                    if ((iVar9 < 0) ||
                       (iVar9 = xmlwrite_string(a,writer,"type","script"), iVar9 < 0))
                    goto LAB_0028272b;
                    pxVar14 = writer->writer;
                    uVar8 = xmlTextWriterEndElement(pxVar14);
                    uVar30 = extraout_RDX_05;
                    if ((int)uVar8 < 0) goto LAB_0028270a;
                  }
                  if ((int)local_98 != 0) goto LAB_0028272b;
                }
              }
              if (((*(byte *)(lVar25 + 0x168) & 2) == 0) ||
                 (lVar26 = *(long *)(lVar25 + 0x60), lVar26 == 0)) {
                for (; lVar25 != *(long *)(lVar25 + 0x58); lVar25 = *(long *)(lVar25 + 0x58)) {
                  uVar8 = xmlTextWriterEndElement(pxVar14);
                  if ((int)uVar8 < 0) goto LAB_002826d8;
                  lVar26 = *(long *)(lVar25 + 0x40);
                  if (lVar26 != 0) goto LAB_0028240b;
                  uVar30 = extraout_RDX_07;
                }
              }
              else {
LAB_0028240b:
                pcVar23 = "file";
                uVar8 = xmlTextWriterStartElement(pxVar14);
                if ((int)uVar8 < 0) goto LAB_002826ac;
                uVar8 = xml_writer_write_attributef
                                  (writer,pcVar23,format_00,(ulong)*(uint *)(lVar26 + 0x18));
                uVar30 = extraout_RDX_06;
                lVar25 = lVar26;
                if ((int)uVar8 < 0) {
                  pcVar23 = "xml_writer_write_attributef() failed: %d";
                  goto LAB_002826e8;
                }
              }
              lVar26 = *(long *)(lVar25 + 0x58);
            } while (lVar25 != lVar26);
            uVar8 = xmlTextWriterEndDocument(pxVar14);
            if (-1 < (int)uVar8) {
              pxVar7 = writer->bp->content;
              uVar24 = (ulong)writer->bp->use;
              *(undefined8 *)((long)pvVar5 + 0x10138) = *(undefined8 *)((long)pvVar5 + 8);
              *(ulong *)((long)pvVar5 + 0x10148) = uVar24;
              piVar18 = (int *)((long)pvVar5 + 0x98);
              iVar9 = *(int *)((long)pvVar5 + 0x80);
              *(int *)((long)pvVar5 + 0x98) = iVar9;
              paVar20 = &__archive_digest;
              if (iVar9 == 1) {
                paVar20 = (archive_digest *)&__archive_digest.sha1init;
                lVar26 = 0x10;
LAB_00282781:
                (*paVar20->md5init)((archive_sha1_ctx *)(lVar26 + (long)piVar18));
              }
              else if (iVar9 == 2) {
                lVar26 = 8;
                goto LAB_00282781;
              }
              local_98 = (la_zstream_conflict *)((long)pvVar5 + 200);
              iVar9 = compression_init_encoder_gzip(&a->archive,local_98,6,iVar9);
              if (iVar9 == 0) {
                *(xmlChar **)((long)pvVar5 + 200) = pxVar7;
                *(ulong *)((long)pvVar5 + 0xd0) = uVar24;
                *(undefined8 *)((long)pvVar5 + 0xd8) = 0;
                pvVar6 = (void *)((long)pvVar5 + 0x120);
                *(void **)((long)pvVar5 + 0xe0) = pvVar6;
                *(undefined8 *)((long)pvVar5 + 0xe8) = 0x10000;
                *(undefined8 *)((long)pvVar5 + 0xf0) = 0;
                local_50 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)
                           &__archive_digest.sha1update;
                local_90 = &__archive_digest;
                local_58 = &__archive_digest.md5update;
                do {
                  if (*(int *)((long)pvVar5 + 0xf8) == 0) {
                    bVar31 = true;
                    s = 0;
                  }
                  else {
                    bVar31 = false;
                    uVar8 = (**(code **)((long)pvVar5 + 0x108))(a,local_98,0);
                    if (1 < uVar8) goto LAB_00282548;
                    s = 0x10000 - *(long *)((long)pvVar5 + 0xe8);
                    bVar31 = uVar8 == 0;
                  }
                  if (*piVar18 == 1) {
                    lVar26 = 0x10;
                    pp_Var22 = local_50;
LAB_0028287b:
                    (**pp_Var22)((archive_md5_ctx *)(lVar26 + (long)piVar18),pvVar6,s);
                  }
                  else if (*piVar18 == 2) {
                    lVar26 = 8;
                    pp_Var22 = local_58;
                    goto LAB_0028287b;
                  }
                  iVar9 = write_to_temp(a,pvVar6,s);
                  if (iVar9 != 0) break;
                  if (!bVar31) goto LAB_002828c7;
                  *(void **)((long)pvVar5 + 0xe0) = pvVar6;
                  *(undefined8 *)((long)pvVar5 + 0xe8) = 0x10000;
                } while( true );
              }
              goto LAB_0028272b;
            }
            pcVar23 = "xml_writer_end_document() failed: %d";
          }
          else {
            uVar8 = xmlTextWriterStartElement(pxVar14,"checksum");
            if ((int)uVar8 < 0) {
LAB_002826ac:
              pcVar23 = "xml_writer_start_element() failed: %d";
            }
            else {
              pcVar23 = (char *)0x0;
              if (*(int *)((long)pvVar5 + 0x80) == 1) {
                pcVar23 = "sha1";
              }
              pcVar15 = "md5";
              if (*(int *)((long)pvVar5 + 0x80) != 2) {
                pcVar15 = pcVar23;
              }
              uVar8 = xmlTextWriterWriteAttribute(pxVar14,"style",pcVar15);
              if ((int)uVar8 < 0) {
                pcVar23 = "xml_writer_write_attribute() failed: %d";
              }
              else {
                iVar9 = xmlwrite_string(a,writer,"offset","0");
                if (iVar9 < 0) goto LAB_0028272b;
                bVar31 = false;
                iVar9 = xmlwrite_fstring(a,writer,"size","%d");
                if (iVar9 < 0) goto LAB_00282548;
                uVar8 = xmlTextWriterEndElement(pxVar14);
                uVar30 = extraout_RDX_00;
                if (-1 < (int)uVar8) goto LAB_00281c53;
LAB_002826d8:
                pcVar23 = "xml_writer_end_element() failed: %d";
              }
            }
          }
LAB_002826e8:
          bVar31 = false;
          archive_set_error(&a->archive,-1,pcVar23,(ulong)uVar8);
          goto LAB_00282548;
        }
        pcVar23 = "xml_writer_start_element() failed: %d";
      }
      bVar31 = false;
      archive_set_error(&a->archive,-1,pcVar23,(ulong)uVar8);
      iVar29 = -0x1e;
      goto LAB_00282548;
    }
    xmlBufferFree(pxVar13);
  }
  free(writer);
LAB_00282501:
  archive_set_error(&a->archive,-1,"xml_writer_create() failed: %d",0xffffffff);
  return -0x1e;
LAB_002828c7:
  if ((*(int *)((long)pvVar5 + 0xf8) != 0) &&
     (iVar9 = (**(code **)((long)pvVar5 + 0x110))(a,local_98), iVar9 != 0)) {
LAB_0028272b:
    bVar31 = false;
    goto LAB_00282548;
  }
  *(undefined8 *)((long)pvVar5 + 0x10140) = *(undefined8 *)((long)pvVar5 + 0xf0);
  *(undefined4 *)((long)pvVar5 + 0x10150) = 1;
  iVar9 = *(int *)((long)pvVar5 + 0x98);
  if (iVar9 == 0) {
    uVar30 = 0;
LAB_0028296f:
    *(undefined8 *)((long)pvVar5 + 0x10160) = uVar30;
  }
  else {
    if (iVar9 == 1) {
      local_90 = (archive_digest *)&local_90->sha1final;
      uVar30 = 0x14;
      lVar26 = 0x10;
LAB_00282946:
      (*local_90->md5init)((archive_md5_ctx *)((long)piVar18 + lVar26));
      iVar9 = *(int *)((long)pvVar5 + 0x98);
      goto LAB_0028296f;
    }
    if (iVar9 == 2) {
      local_90 = (archive_digest *)&local_90->md5final;
      uVar30 = 0x10;
      lVar26 = 8;
      goto LAB_00282946;
    }
  }
  *(int *)((long)pvVar5 + 0x10158) = iVar9;
  iVar29 = 0;
  bVar31 = true;
LAB_00282548:
  xmlFreeTextWriter(writer->writer);
  xmlBufferFree(writer->bp);
  free(writer);
  if (!bVar31) {
    return iVar29;
  }
  *(undefined8 *)((long)pvVar3 + 0x120) = 0x1001c0021726178;
  uVar24 = *(ulong *)((long)pvVar3 + 0x10140);
  *(ulong *)((long)pvVar3 + 0x128) =
       uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 | (uVar24 & 0xff0000000000) >> 0x18 |
       (uVar24 & 0xff00000000) >> 8 | (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18 |
       (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38;
  uVar21 = *(ulong *)((long)pvVar3 + 0x10148);
  *(ulong *)((long)pvVar3 + 0x130) =
       uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 | (uVar21 & 0xff0000000000) >> 0x18 |
       (uVar21 & 0xff00000000) >> 8 | (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
       (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
  uVar2 = *(undefined4 *)((long)pvVar3 + 0x10158);
  *(char *)((long)pvVar3 + 0x138) = (char)((uint)uVar2 >> 0x18);
  *(char *)((long)pvVar3 + 0x139) = (char)((uint)uVar2 >> 0x10);
  *(char *)((long)pvVar3 + 0x13a) = (char)((uint)uVar2 >> 8);
  *(char *)((long)pvVar3 + 0x13b) = (char)uVar2;
  *(undefined8 *)((long)pvVar3 + 0x10120) = 0xffe4;
  iVar9 = copy_out(a,*(uint64_t *)((long)pvVar3 + 0x10138),uVar24);
  if (iVar9 != 0) {
    return iVar9;
  }
  uVar24 = *(ulong *)((long)pvVar3 + 0x10160);
  if (uVar24 == 0) {
    offset = 0;
  }
  else {
    uVar21 = *(ulong *)((long)pvVar3 + 0x10120);
    if (uVar21 < uVar24) {
      pvVar5 = a->format_data;
      iVar9 = __archive_write_output
                        (a,(void *)((long)pvVar5 + 0x120),
                         0x10000 - *(long *)((long)pvVar5 + 0x10120));
      if (iVar9 != 0) {
        return iVar9;
      }
      *(undefined8 *)((long)pvVar5 + 0x10120) = 0x10000;
      uVar21 = *(ulong *)((long)pvVar3 + 0x10120);
      uVar24 = *(size_t *)((long)pvVar3 + 0x10160);
    }
    memcpy((void *)((long)pvVar3 + (0x10120 - uVar21)),(void *)((long)pvVar3 + 0x10168),uVar24);
    offset = *(uint64_t *)((long)pvVar3 + 0x10160);
    *(long *)((long)pvVar3 + 0x10120) = *(long *)((long)pvVar3 + 0x10120) - offset;
  }
  iVar9 = copy_out(a,offset,local_48);
  if (iVar9 == 0) {
    pvVar3 = a->format_data;
    iVar9 = __archive_write_output
                      (a,(void *)((long)pvVar3 + 0x120),0x10000 - *(long *)((long)pvVar3 + 0x10120))
    ;
    if (iVar9 == 0) {
      *(undefined8 *)((long)pvVar3 + 0x10120) = 0x10000;
      return 0;
    }
    return iVar9;
  }
  return iVar9;
}

Assistant:

static int
xar_close(struct archive_write *a)
{
	struct xar *xar;
	unsigned char *wb;
	uint64_t length;
	int r;

	xar = (struct xar *)a->format_data;

	/* Empty! */
	if (xar->root->children.first == NULL)
		return (ARCHIVE_OK);

	/* Save the length of all file extended attributes and contents. */
	length = xar->temp_offset;

	/* Connect hardlinked files */
	file_connect_hardlink_files(xar);

	/* Make the TOC */
	r = make_toc(a);
	if (r != ARCHIVE_OK)
		return (r);
	/*
	 * Make the xar header on wbuff(write buffer).
	 */
	wb = xar->wbuff;
	xar->wbuff_remaining = sizeof(xar->wbuff);
	archive_be32enc(&wb[0], HEADER_MAGIC);
	archive_be16enc(&wb[4], HEADER_SIZE);
	archive_be16enc(&wb[6], HEADER_VERSION);
	archive_be64enc(&wb[8], xar->toc.length);
	archive_be64enc(&wb[16], xar->toc.size);
	archive_be32enc(&wb[24], xar->toc.a_sum.alg);
	xar->wbuff_remaining -= HEADER_SIZE;

	/*
	 * Write the TOC
	 */
	r = copy_out(a, xar->toc.temp_offset, xar->toc.length);
	if (r != ARCHIVE_OK)
		return (r);

	/* Write the checksum value of the TOC. */
	if (xar->toc.a_sum.len) {
		if (xar->wbuff_remaining < xar->toc.a_sum.len) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		memcpy(wb, xar->toc.a_sum.val, xar->toc.a_sum.len);
		xar->wbuff_remaining -= xar->toc.a_sum.len;
	}

	/*
	 * Write all file extended attributes and contents.
	 */
	r = copy_out(a, xar->toc.a_sum.len, length);
	if (r != ARCHIVE_OK)
		return (r);
	r = flush_wbuff(a);
	return (r);
}